

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O2

String __thiscall MiniScript::String::Format(String *this,int num,char *formatSpec)

{
  undefined8 extraout_RDX;
  String SVar1;
  char buf [32];
  
  snprintf(buf,0x20,formatSpec,num);
  String(this,buf);
  SVar1._8_8_ = extraout_RDX;
  SVar1.ss = (StringStorage *)this;
  return SVar1;
}

Assistant:

String String::Format(int num, const char* formatSpec) {
		char buf[32];
		snprintf(buf, 32, formatSpec, num);
		return buf;
	}